

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O0

int st__delete(st__table *table,char **keyp,char **value)

{
  st__table_entry *psVar1;
  int iVar2;
  bool bVar3;
  int local_50;
  int local_4c;
  st__table_entry **local_48;
  st__table_entry **last;
  st__table_entry *ptr;
  char *key;
  int hash_val;
  char **value_local;
  char **keyp_local;
  st__table *table_local;
  
  psVar1 = (st__table_entry *)*keyp;
  if (table->hash == st__ptrhash) {
    local_4c = (int)(((ulong)psVar1 >> 2) % (ulong)(long)table->num_bins);
  }
  else {
    if (table->hash == st__numhash) {
      local_50 = Abc_AbsInt((int)psVar1);
      local_50 = local_50 % table->num_bins;
    }
    else {
      local_50 = (*table->hash)((char *)psVar1,table->num_bins);
    }
    local_4c = local_50;
  }
  local_48 = table->bins + local_4c;
  last = (st__table_entry **)*local_48;
  while( true ) {
    bVar3 = false;
    if (last != (st__table_entry **)0x0) {
      if ((table->compare == st__numcmp) || (table->compare == st__ptrcmp)) {
        bVar3 = psVar1 == *last;
      }
      else {
        iVar2 = (*table->compare)((char *)psVar1,(char *)*last);
        bVar3 = iVar2 == 0;
      }
      bVar3 = !bVar3;
    }
    if (!bVar3) break;
    local_48 = last + 2;
    last = (st__table_entry **)*local_48;
  }
  if ((last != (st__table_entry **)0x0) && (table->reorder_flag != 0)) {
    *local_48 = last[2];
    last[2] = table->bins[local_4c];
    table->bins[local_4c] = (st__table_entry *)last;
  }
  if (last == (st__table_entry **)0x0) {
    table_local._4_4_ = 0;
  }
  else {
    *local_48 = last[2];
    if (value != (char **)0x0) {
      *value = (char *)last[1];
    }
    *keyp = (char *)*last;
    if (last != (st__table_entry **)0x0) {
      free(last);
    }
    table->num_entries = table->num_entries + -1;
    table_local._4_4_ = 1;
  }
  return table_local._4_4_;
}

Assistant:

int
 st__delete( st__table *table, const char **keyp, char **value)
{
    int hash_val;
    const char *key = *keyp;
    st__table_entry *ptr, **last;

    hash_val = do_hash(key, table);

    FIND_ENTRY(table, hash_val, key, ptr ,last);
    
    if (ptr == NULL) {
    return 0;
    }

    *last = ptr->next;
    if (value != NULL) *value = ptr->record;
    *keyp = ptr->key;
    ABC_FREE(ptr);
    table->num_entries--;
    return 1;
}